

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipatchtexture.cpp
# Opt level: O2

bool __thiscall FMultiPatchTexture::UseBasePalette(FMultiPatchTexture *this)

{
  undefined8 *puVar1;
  char cVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  
  if (((this->super_FTexture).field_0x32 & 1) == 0) {
    lVar4 = 0x18;
    lVar5 = -1;
    do {
      lVar5 = lVar5 + 1;
      bVar3 = this->NumParts <= lVar5;
      if (this->NumParts <= lVar5) {
        return bVar3;
      }
      puVar1 = (undefined8 *)((long)&this->Parts->OriginX + lVar4);
      lVar4 = lVar4 + 0x28;
      cVar2 = (**(code **)(*(long *)*puVar1 + 0x28))();
    } while (cVar2 != '\0');
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool FMultiPatchTexture::UseBasePalette() 
{ 
	if (bComplex) return false;
	for(int i=0;i<NumParts;i++)
	{
		if (!Parts[i].Texture->UseBasePalette()) return false;
	}
	return true;
}